

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

WebPEncodingError
VP8LGetBackwardReferences
          (int width,int height,uint32_t *argb,int quality,int low_effort,int lz77_types_to_try,
          int cache_bits_max,int do_no_cache,VP8LHashChain *hash_chain,VP8LBackwardRefs *refs,
          int *cache_bits_best)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t uVar3;
  long *plVar4;
  long lVar5;
  PixOrCopyBlock **ppPVar6;
  PixOrCopyBlock *pPVar7;
  PixOrCopyBlock *pPVar8;
  PixOrCopyBlock **ppPVar9;
  PixOrCopyBlock *pPVar10;
  PixOrCopyBlock *pPVar11;
  uint64_t nmemb;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  PixOrCopyBlock **ppPVar18;
  void *ptr;
  short *psVar19;
  long **pplVar20;
  VP8LHistogram *pVVar21;
  long lVar22;
  byte bVar23;
  uint uVar24;
  VP8LBackwardRefs *refs_00;
  VP8LBackwardRefs *pVVar25;
  short sVar26;
  uint uVar27;
  ulong uVar28;
  PixOrCopy *pPVar29;
  int iVar30;
  uint uVar31;
  PixOrCopy v;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  long *plVar36;
  uint32_t *puVar37;
  VP8LHashChain *hash_chain_00;
  undefined4 in_register_0000008c;
  VP8LBackwardRefs *pVVar38;
  ushort uVar39;
  uint uVar40;
  int *piVar41;
  PixOrCopyBlock *pPVar42;
  PixOrCopy *pPVar43;
  uint uVar44;
  double dVar45;
  long lVar46;
  uint uVar47;
  long lVar48;
  VP8LColorCache *pVVar49;
  bool bVar50;
  bool bVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  int pix_count;
  int lz77_types_best [2];
  double bit_costs_best [2];
  VP8LBackwardRefs tmp;
  int cc_init [11];
  double local_290;
  PixOrCopy *local_268;
  double local_240;
  uint local_234;
  uint local_220 [2];
  undefined4 *local_218;
  PixOrCopyBlock *pPStack_210;
  VP8LHistogram *local_208;
  VP8LBackwardRefs *local_200;
  PixOrCopyBlock *local_1f8;
  VP8LBackwardRefs *local_1f0;
  double local_1e8 [3];
  long local_1d0;
  VP8LBackwardRefs *local_1c8;
  long local_1c0;
  VP8LBackwardRefs *local_1b8;
  uint64_t local_1b0;
  long *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [8];
  PixOrCopyBlock *pPStack_190;
  PixOrCopyBlock **local_188;
  PixOrCopyBlock *pPStack_180;
  PixOrCopyBlock *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  long *local_e8 [16];
  int local_68 [14];
  
  pVVar38 = (VP8LBackwardRefs *)CONCAT44(in_register_0000008c,lz77_types_to_try);
  if (low_effort == 0) {
    local_220[0] = 0;
    local_220[1] = 0;
    local_1e8[0] = 1.79769313486232e+308;
    local_1e8[1] = 1.79769313486232e+308;
    local_200 = refs + 1;
    refs_00 = refs + 2;
    if (do_no_cache == 0) {
      refs_00 = local_200;
    }
    local_218 = (uint32_t *)0x0;
    pPStack_210 = (PixOrCopyBlock *)0x0;
    local_208 = VP8LAllocateHistogram(10);
    local_234 = 1;
    if (local_208 != (VP8LHistogram *)0x0) {
      if (lz77_types_to_try != 0) {
        uVar13 = height * width;
        local_1b0 = (long)(int)uVar13;
        uVar24 = uVar13 - 2;
        ppPVar18 = &refs_00->refs_;
        local_1f0 = (VP8LBackwardRefs *)-(long)width;
        local_1b8 = (VP8LBackwardRefs *)((ulong)(uint)width << 0x20);
        local_1f8 = (PixOrCopyBlock *)&refs->refs_;
        pVVar25 = (VP8LBackwardRefs *)((ulong)uVar24 + 1);
        local_1c8 = pVVar25;
        local_1c0 = (long)(int)uVar24;
        local_1d0 = (long)(int)uVar24 * 2 + 2;
        uVar24 = 1;
        do {
          nmemb = local_1b0;
          if ((uVar24 & lz77_types_to_try) == 0) {
            iVar12 = 5;
          }
          else {
            if (uVar24 == 1) {
              pVVar25 = (VP8LBackwardRefs *)hash_chain;
              uVar47 = BackwardReferencesLz77
                                 (width,height,argb,(int)hash_chain,(VP8LHashChain *)refs_00,pVVar38
                                 );
            }
            else if (uVar24 == 4) {
              local_218 = (undefined4 *)WebPSafeMalloc(local_1b0,4);
              if (local_218 == (uint32_t *)0x0) {
                iVar12 = 2;
                goto LAB_00149d10;
              }
              pPStack_210 = (PixOrCopyBlock *)CONCAT44(pPStack_210._4_4_,(int)nmemb);
              local_128 = 0;
              uStack_120 = 0;
              local_138 = 0;
              uStack_130 = 0;
              local_148 = 0;
              uStack_140 = 0;
              local_158 = 0;
              uStack_150 = 0;
              local_168 = 0;
              uStack_160 = 0;
              local_178 = (PixOrCopyBlock *)0x0;
              uStack_170 = 0;
              local_188 = (PixOrCopyBlock **)0x0;
              pPStack_180 = (PixOrCopyBlock *)0x0;
              local_198 = (undefined1  [8])0x0;
              pPStack_190 = (PixOrCopyBlock *)0x0;
              local_e8[0xe] = (long *)0x0;
              local_e8[0xf] = (long *)0x0;
              local_e8[0xc] = (long *)0x0;
              local_e8[0xd] = (long *)0x0;
              local_e8[10] = (long *)0x0;
              local_e8[0xb] = (long *)0x0;
              local_e8[8] = (long *)0x0;
              local_e8[9] = (long *)0x0;
              local_e8[6] = (long *)0x0;
              local_e8[7] = (long *)0x0;
              local_e8[4] = (long *)0x0;
              local_e8[5] = (long *)0x0;
              local_e8[2] = (long *)0x0;
              local_e8[3] = (long *)0x0;
              local_e8[0] = (long *)0x0;
              local_e8[1] = (long *)0x0;
              ptr = WebPSafeMalloc(nmemb,2);
              if (ptr == (void *)0x0) {
                uVar47 = 0;
              }
              else {
                *(undefined2 *)((long)ptr + local_1c0 * 2 + 2) = 1;
                if (1 < (int)uVar13) {
                  psVar19 = (short *)((long)ptr + local_1d0);
                  pVVar38 = local_1c8;
                  do {
                    sVar26 = 1;
                    if (argb[(long)((long)&pVVar38[-1].last_block_ + 7)] == argb[(long)pVVar38]) {
                      sVar26 = (ushort)(*psVar19 != 0xfff) + *psVar19;
                    }
                    psVar19[-1] = sVar26;
                    psVar19 = psVar19 + -1;
                    pVVar25 = (VP8LBackwardRefs *)((long)&pVVar38[-1].last_block_ + 7);
                    bVar50 = 0 < (long)pVVar38;
                    pVVar38 = pVVar25;
                  } while (pVVar25 != (VP8LBackwardRefs *)0x0 && bVar50);
                }
                iVar12 = 0;
                iVar15 = 0;
                do {
                  iVar14 = -6;
                  do {
                    iVar30 = iVar12 + iVar14;
                    if ((0 < iVar30) &&
                       (iVar16 = VP8LDistanceToPlaneCode(width,iVar30), iVar16 < 0x21)) {
                      *(int *)((long)&local_1a0 + (long)iVar16 * 4 + 4) = iVar30;
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 != 7);
                  iVar15 = iVar15 + 1;
                  iVar12 = iVar12 + width;
                } while (iVar15 != 7);
                lVar46 = 0;
                uVar35 = 0;
                do {
                  if (*(int *)(local_198 + lVar46 * 4) != 0) {
                    iVar12 = (int)uVar35;
                    uVar35 = (ulong)(iVar12 + 1);
                    *(int *)(local_198 + (long)iVar12 * 4) = *(int *)(local_198 + lVar46 * 4);
                  }
                  lVar46 = lVar46 + 1;
                } while (lVar46 != 0x20);
                uVar47 = (uint)uVar35;
                if ((int)uVar47 < 1) {
                  pVVar25 = (VP8LBackwardRefs *)0x0;
                }
                else {
                  uVar32 = 0;
                  pVVar25 = (VP8LBackwardRefs *)0x0;
                  do {
                    iVar12 = *(int *)(local_198 + uVar32 * 4);
                    uVar28 = 1;
                    do {
                      iVar15 = *(int *)((long)&local_1a0 + uVar28 * 4 + 4) + 1;
                      if (uVar35 <= uVar28) break;
                      uVar28 = uVar28 + 1;
                    } while (iVar12 != iVar15);
                    if (iVar12 != iVar15) {
                      *(int *)((long)local_e8 + (long)(int)pVVar25 * 4) = iVar12;
                      pVVar25 = (VP8LBackwardRefs *)(ulong)((int)pVVar25 + 1);
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != uVar35);
                }
                *local_218 = 0;
                pVVar38 = pVVar25;
                if (1 < (int)uVar13) {
                  puVar37 = hash_chain->offset_length_;
                  uVar31 = 0xffffffff;
                  uVar32 = 1;
                  uVar34 = 0xffffffff;
                  do {
                    uVar40 = puVar37[uVar32] & 0xfff;
                    if (uVar40 == 0xfff) {
                      uVar17 = puVar37[uVar32] >> 0xc;
                      if ((int)uVar47 < 1) {
                        bVar50 = false;
                      }
                      else {
                        lVar46 = 0;
                        do {
                          bVar50 = uVar17 == *(uint *)(local_198 + lVar46 * 4);
                          if (bVar50) break;
                          bVar51 = uVar35 - 1 != lVar46;
                          lVar46 = lVar46 + 1;
                        } while (bVar51);
                      }
                      local_290 = (double)(ulong)uVar17;
                    }
                    else {
                      bVar50 = false;
                    }
                    if (!bVar50) {
                      uVar40 = uVar34 - 1;
                      local_240._0_4_ = (uint)pVVar25;
                      if (0xffc < uVar34 - 2) {
                        uVar40 = 0;
                        uVar31 = 0;
                        local_240._0_4_ = uVar47;
                      }
                      if ((int)local_240._0_4_ < 1) {
                        local_290 = (double)(ulong)uVar31;
                      }
                      else {
                        uVar28 = 0;
                        local_290 = (double)(ulong)uVar31;
                        do {
                          pplVar20 = (long **)local_198;
                          if (uVar34 - 2 < 0xffd) {
                            pplVar20 = local_e8;
                          }
                          uVar31 = *(uint *)((long)pplVar20 + uVar28 * 4);
                          uVar17 = (int)uVar32 - uVar31;
                          bVar50 = true;
                          if ((-1 < (int)uVar17) && (argb[uVar17] == argb[uVar32])) {
                            uVar44 = 0;
                            uVar33 = uVar32 & 0xffffffff;
                            do {
                              uVar2 = *(ushort *)((long)ptr + (ulong)uVar17 * 2);
                              uVar1 = *(ushort *)((long)ptr + (long)(int)uVar33 * 2);
                              uVar27 = (uint)uVar2;
                              if (uVar2 == uVar1) {
                                uVar17 = uVar17 + uVar27;
                                uVar33 = (ulong)((int)uVar33 + uVar27);
                              }
                              else {
                                uVar39 = uVar1;
                                if (uVar2 < uVar1) {
                                  uVar39 = uVar2;
                                }
                                uVar27 = (uint)uVar39;
                              }
                              uVar44 = uVar44 + uVar27;
                            } while ((((uVar2 == uVar1) && (uVar44 < 0x1000)) &&
                                     ((int)uVar33 < (int)uVar13)) &&
                                    (argb[uVar17] == argb[(int)uVar33]));
                            if ((int)uVar40 < (int)uVar44) {
                              bVar50 = uVar44 < 0xfff;
                              uVar40 = uVar44;
                              if (!bVar50) {
                                uVar40 = 0xfff;
                              }
                              local_290 = (double)(ulong)uVar31;
                            }
                          }
                        } while ((bVar50) && (uVar28 = uVar28 + 1, uVar28 < local_240._0_4_));
                      }
                    }
                    uVar17 = local_290._0_4_ << 0xc | uVar40;
                    uVar34 = uVar40;
                    if ((int)uVar40 < 5) {
                      uVar17 = 0;
                      uVar34 = 0;
                    }
                    pVVar38 = (VP8LBackwardRefs *)(ulong)uVar34;
                    uVar31 = local_290._0_4_;
                    if ((int)uVar40 < 5) {
                      uVar31 = 0;
                    }
                    local_218[uVar32] = uVar17;
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != uVar13);
                }
                *local_218 = 0;
                WebPSafeFree(ptr);
                pVVar25 = (VP8LBackwardRefs *)&local_218;
                uVar47 = BackwardReferencesLz77
                                   (width,height,argb,(int)pVVar25,(VP8LHashChain *)refs_00,pVVar38)
                ;
              }
            }
            else {
              uVar47 = 0;
              if (uVar24 == 2) {
                if (refs_00->tail_ != (PixOrCopyBlock **)0x0) {
                  pVVar25 = (VP8LBackwardRefs *)refs_00->free_blocks_;
                  *refs_00->tail_ = (PixOrCopyBlock *)pVVar25;
                }
                refs_00->free_blocks_ = refs_00->refs_;
                refs_00->tail_ = ppPVar18;
                refs_00->last_block_ = (PixOrCopyBlock *)0x0;
                refs_00->refs_ = (PixOrCopyBlock *)0x0;
                VP8LBackwardRefsCursorAdd(refs_00,(PixOrCopy)((ulong)*argb << 0x20 | 0x10000));
                if (1 < (int)uVar13) {
                  uVar47 = 1;
                  do {
                    iVar12 = uVar13 - uVar47;
                    if (0xffe < (int)(uVar13 - uVar47)) {
                      iVar12 = 0xfff;
                    }
                    puVar37 = argb + uVar47;
                    pVVar25 = (VP8LBackwardRefs *)(ulong)*puVar37;
                    iVar15 = 0;
                    iVar14 = 0;
                    if (*puVar37 == puVar37[-1]) {
                      pVVar25 = (VP8LBackwardRefs *)argb;
                      iVar14 = (*VP8LVectorMismatch)(puVar37,argb + ((ulong)uVar47 - 1),iVar12);
                    }
                    if ((width <= (int)uVar47) &&
                       (pVVar25 = local_1f0, *puVar37 == puVar37[(long)local_1f0])) {
                      iVar15 = (*VP8LVectorMismatch)(puVar37,puVar37 + (long)local_1f0,iVar12);
                    }
                    if ((iVar14 < 4) || (iVar14 < iVar15)) {
                      if (iVar15 < 4) {
                        v = (PixOrCopy)((ulong)*puVar37 << 0x20 | 0x10000);
                        iVar15 = 1;
                      }
                      else {
                        v = (PixOrCopy)
                            ((long)&local_1b8->block_size_ + (ulong)(uint)(iVar15 << 0x10) + 2);
                        pVVar25 = local_1b8;
                      }
                    }
                    else {
                      v = (PixOrCopy)((ulong)(uint)(iVar14 << 0x10) | 0x100000002);
                      iVar15 = iVar14;
                    }
                    VP8LBackwardRefsCursorAdd(refs_00,v);
                    uVar47 = uVar47 + iVar15;
                  } while ((int)uVar47 < (int)uVar13);
                }
                uVar47 = (uint)(refs_00->error_ == 0);
              }
            }
            if (uVar47 == 0) {
              iVar12 = 2;
            }
            else {
              local_240 = 0.0;
              pVVar25 = (VP8LBackwardRefs *)0x1;
              do {
                uVar47 = cache_bits_max;
                if (pVVar25 == (VP8LBackwardRefs *)0x1) {
                  uVar47 = 0;
                }
                iVar12 = 9;
                pVVar38 = pVVar25;
                if (pVVar25 != (VP8LBackwardRefs *)0x1 || do_no_cache != 0) {
                  if (pVVar25 == (VP8LBackwardRefs *)0x0) {
                    uVar34 = uVar47;
                    if (quality < 0x1a) {
                      uVar34 = 0;
                    }
                    local_68[8] = 0;
                    local_68[9] = 0;
                    local_68[10] = 0;
                    local_68[4] = 0;
                    local_68[5] = 0;
                    local_68[6] = 0;
                    local_68[7] = 0;
                    local_68[0] = 0;
                    local_68[1] = 0;
                    local_68[2] = 0;
                    local_68[3] = 0;
                    pPVar42 = *ppPVar18;
                    if (pPVar42 == (PixOrCopyBlock *)0x0) {
                      local_268 = (PixOrCopy *)0x0;
                      pPVar29 = (PixOrCopy *)0x0;
                    }
                    else {
                      pPVar29 = pPVar42->start_;
                      local_268 = pPVar29 + pPVar42->size_;
                    }
                    local_e8[8] = (long *)0x0;
                    local_e8[9] = (long *)0x0;
                    local_e8[6] = (long *)0x0;
                    local_e8[7] = (long *)0x0;
                    local_e8[4] = (long *)0x0;
                    local_e8[5] = (long *)0x0;
                    local_e8[2] = (long *)0x0;
                    local_e8[3] = (long *)0x0;
                    local_e8[0] = (long *)0x0;
                    local_e8[1] = (long *)0x0;
                    local_e8[10] = (long *)0x0;
                    if (uVar34 == 0) {
                      bVar50 = true;
                      uVar47 = 0;
                    }
                    else {
                      if (-1 < (int)uVar34) {
                        local_290 = (double)(ulong)(uVar34 + 1);
                        pVVar49 = (VP8LColorCache *)local_198;
                        dVar45 = 0.0;
                        do {
                          iVar12 = SUB84(dVar45,0);
                          pVVar21 = VP8LAllocateHistogram(iVar12);
                          local_e8[(long)dVar45] = (long *)pVVar21;
                          bVar50 = false;
                          if (pVVar21 == (VP8LHistogram *)0x0) goto LAB_00149ae7;
                          VP8LHistogramInit(pVVar21,iVar12,1);
                          if (dVar45 != 0.0) {
                            iVar12 = VP8LColorCacheInit(pVVar49,iVar12);
                            local_68[(long)dVar45] = iVar12;
                            if (iVar12 == 0) goto LAB_00149ae7;
                          }
                          dVar45 = (double)((long)dVar45 + 1);
                          pVVar49 = pVVar49 + 1;
                        } while (local_290 != dVar45);
                      }
                      if (pPVar29 != (PixOrCopy *)0x0) {
                        bVar23 = 0x20 - (char)uVar34;
                        local_1a8 = local_e8[0];
                        local_290 = (double)((ulong)uVar34 + 1);
                        puVar37 = argb;
                        do {
                          if (pPVar29->mode == '\0') {
                            uVar31 = *puVar37;
                            pVVar38 = (VP8LBackwardRefs *)(ulong)uVar31;
                            puVar37 = puVar37 + 1;
                            uVar32 = (ulong)(uVar31 >> 8 & 0xff);
                            piVar41 = (int *)((long)local_e8[0] + (ulong)(byte)uVar31 * 4 + 0x408);
                            *piVar41 = *piVar41 + 1;
                            piVar41 = (int *)(*local_e8[0] + uVar32 * 4);
                            *piVar41 = *piVar41 + 1;
                            uVar35 = (ulong)(uVar31 >> 0x10 & 0xff);
                            piVar41 = (int *)((long)local_e8[0] + uVar35 * 4 + 8);
                            *piVar41 = *piVar41 + 1;
                            piVar41 = (int *)((long)local_e8[0] +
                                             (ulong)(uVar31 >> 0x18) * 4 + 0x808);
                            *piVar41 = *piVar41 + 1;
                            if (0 < (int)uVar34) {
                              local_1a0 = pPVar42;
                              uVar40 = uVar31 * 0x1e35a7bd >> (bVar23 & 0x1f);
                              dVar45 = local_290;
                              plVar36 = (long *)(local_198 + (ulong)uVar34 * 0x10);
                              do {
                                if (*(uint *)(*plVar36 + (ulong)uVar40 * 4) == uVar31) {
                                  piVar41 = (int *)(*local_e8[(long)dVar45 + -1] +
                                                    (long)(int)uVar40 * 4 + 0x460);
                                }
                                else {
                                  *(uint *)(*plVar36 + (ulong)uVar40 * 4) = uVar31;
                                  plVar4 = local_e8[(long)dVar45 + -1];
                                  piVar41 = (int *)((long)plVar4 + (ulong)(byte)uVar31 * 4 + 0x408);
                                  *piVar41 = *piVar41 + 1;
                                  piVar41 = (int *)(*plVar4 + uVar32 * 4);
                                  *piVar41 = *piVar41 + 1;
                                  piVar41 = (int *)((long)plVar4 + uVar35 * 4 + 8);
                                  *piVar41 = *piVar41 + 1;
                                  piVar41 = (int *)((long)plVar4 +
                                                   (ulong)(uVar31 >> 0x18) * 4 + 0x808);
                                }
                                *piVar41 = *piVar41 + 1;
                                uVar40 = (int)uVar40 >> 1;
                                dVar45 = (double)((long)dVar45 + -1);
                                plVar36 = plVar36 + -2;
                              } while (1 < (long)dVar45);
                            }
                          }
                          else {
                            uVar2 = pPVar29->len;
                            pVVar38 = (VP8LBackwardRefs *)(ulong)uVar2;
                            if (uVar2 < 0x200) {
                              uVar31 = (uint)kPrefixEncodeCode[(uint)uVar2].code_;
                            }
                            else {
                              uVar40 = uVar2 - 1;
                              uVar31 = 0x1f;
                              if (uVar40 != 0) {
                                for (; uVar40 >> uVar31 == 0; uVar31 = uVar31 - 1) {
                                }
                              }
                              uVar31 = (uint)((uVar40 >> ((byte)(0x1e - (char)(uVar31 ^ 0x1f)) &
                                                         0x1f) & 1) != 0) + (uVar31 ^ 0x1f) * 2 ^
                                       0x3e;
                            }
                            uVar40 = *puVar37;
                            if (-1 < (int)uVar34) {
                              uVar35 = 0;
                              do {
                                piVar41 = (int *)(*local_e8[uVar35] + 0x400 + (long)(int)uVar31 * 4)
                                ;
                                *piVar41 = *piVar41 + 1;
                                uVar35 = uVar35 + 1;
                              } while (uVar34 + 1 != uVar35);
                            }
                            uVar40 = ~uVar40;
                            do {
                              if (*puVar37 != uVar40) {
                                if (0 < (int)uVar34) {
                                  uVar31 = *puVar37 * 0x1e35a7bd >> (bVar23 & 0x1f);
                                  plVar36 = (long *)(local_198 + (ulong)uVar34 * 0x10);
                                  dVar45 = local_290;
                                  do {
                                    *(uint32_t *)(*plVar36 + (long)(int)uVar31 * 4) = *puVar37;
                                    uVar31 = (int)uVar31 >> 1;
                                    dVar45 = (double)((long)dVar45 + -1);
                                    plVar36 = plVar36 + -2;
                                  } while (1 < (long)dVar45);
                                }
                                uVar40 = *puVar37;
                              }
                              puVar37 = puVar37 + 1;
                              uVar31 = (int)pVVar38 - 1;
                              pVVar38 = (VP8LBackwardRefs *)(ulong)uVar31;
                            } while (uVar31 != 0);
                          }
                          pPVar29 = pPVar29 + 1;
                          if (pPVar29 == local_268) {
                            pPVar42 = pPVar42->next_;
                            if (pPVar42 == (PixOrCopyBlock *)0x0) {
                              local_268 = (PixOrCopy *)0x0;
                              pPVar29 = (PixOrCopy *)0x0;
                            }
                            else {
                              pPVar29 = pPVar42->start_;
                              local_268 = pPVar29 + pPVar42->size_;
                            }
                          }
                        } while (pPVar29 != (PixOrCopy *)0x0);
                      }
                      bVar50 = true;
                      if (-1 < (int)uVar34) {
                        uVar35 = 0;
                        uVar52 = 0x40000000;
                        uVar54 = 0x46293e59;
                        do {
                          local_290 = (double)CONCAT44(uVar54,uVar52);
                          dVar45 = VP8LHistogramEstimateBits((VP8LHistogram *)local_e8[uVar35]);
                          uVar53 = SUB84(dVar45,0);
                          uVar55 = (int)((ulong)dVar45 >> 0x20);
                          uVar31 = (uint)uVar35;
                          if (local_290 <= dVar45 && uVar35 != 0) {
                            uVar53 = uVar52;
                            uVar55 = uVar54;
                            uVar31 = uVar47;
                          }
                          uVar47 = uVar31;
                          uVar35 = uVar35 + 1;
                          uVar52 = uVar53;
                          uVar54 = uVar55;
                        } while (uVar34 + 1 != uVar35);
                      }
LAB_00149ae7:
                      if (-1 < (int)uVar34) {
                        pVVar49 = (VP8LColorCache *)local_198;
                        uVar35 = 0;
                        do {
                          if (local_68[uVar35] != 0) {
                            VP8LColorCacheClear(pVVar49);
                          }
                          VP8LFreeHistogram((VP8LHistogram *)local_e8[uVar35]);
                          uVar35 = uVar35 + 1;
                          pVVar49 = pVVar49 + 1;
                        } while (uVar34 + 1 != uVar35);
                      }
                    }
                    iVar12 = 2;
                    if (!bVar50) goto LAB_00149615;
                    if (0 < (int)uVar47) {
                      pPVar42 = *ppPVar18;
                      if (pPVar42 == (PixOrCopyBlock *)0x0) {
                        pPVar29 = (PixOrCopy *)0x0;
                        pPVar43 = (PixOrCopy *)0x0;
                      }
                      else {
                        pPVar43 = pPVar42->start_;
                        pPVar29 = pPVar43 + pPVar42->size_;
                      }
                      iVar15 = VP8LColorCacheInit((VP8LColorCache *)local_198,uVar47);
                      if (iVar15 == 0) goto LAB_00149615;
                      if (pPVar43 != (PixOrCopy *)0x0) {
                        iVar12 = 0;
                        do {
                          if (pPVar43->mode == '\0') {
                            uVar3 = pPVar43->argb_or_distance;
                            uVar31 = uVar3 * 0x1e35a7bd >> ((byte)pPStack_190 & 0x1f);
                            uVar34 = 0xffffffff;
                            if (*(uint32_t *)((long)local_198 + (long)(int)uVar31 * 4) == uVar3) {
                              uVar34 = uVar31;
                            }
                            if ((int)uVar34 < 0) {
                              *(uint32_t *)((long)local_198 + (long)(int)uVar31 * 4) = uVar3;
                            }
                            else {
                              *pPVar43 = (PixOrCopy)((ulong)uVar34 << 0x20 | 0x10001);
                            }
                            iVar12 = iVar12 + 1;
                          }
                          else {
                            uVar2 = pPVar43->len;
                            if (uVar2 != 0) {
                              lVar46 = 0;
                              do {
                                uVar34 = argb[iVar12 + lVar46];
                                pVVar38 = (VP8LBackwardRefs *)(ulong)uVar34;
                                *(uint *)((long)local_198 +
                                         (long)(int)(uVar34 * 0x1e35a7bd >>
                                                    ((byte)pPStack_190 & 0x1f)) * 4) = uVar34;
                                lVar46 = lVar46 + 1;
                              } while ((uint)uVar2 != (uint)lVar46);
                              iVar12 = iVar12 + (uint)lVar46;
                            }
                          }
                          pPVar43 = pPVar43 + 1;
                          if (pPVar43 == pPVar29) {
                            pPVar42 = pPVar42->next_;
                            if (pPVar42 == (PixOrCopyBlock *)0x0) {
                              pPVar29 = (PixOrCopy *)0x0;
                              pPVar43 = (PixOrCopy *)0x0;
                            }
                            else {
                              pPVar43 = pPVar42->start_;
                              pPVar29 = pPVar43 + pPVar42->size_;
                            }
                          }
                        } while (pPVar43 != (PixOrCopy *)0x0);
                      }
                      VP8LColorCacheClear((VP8LColorCache *)local_198);
                    }
                  }
                  pVVar21 = local_208;
                  if (((do_no_cache == 0) || (pVVar25 != (VP8LBackwardRefs *)0x0)) || (uVar47 != 0))
                  {
                    VP8LHistogramCreate(local_208,refs_00,uVar47);
                    local_240 = VP8LHistogramEstimateBits(pVVar21);
                  }
                  iVar12 = 0;
                  if (local_240 < local_1e8[(long)pVVar25]) {
                    if (pVVar25 == (VP8LBackwardRefs *)0x1) {
                      iVar12 = BackwardRefsClone(refs_00,local_200);
                      if (iVar12 == 0) {
                        iVar12 = 2;
                        goto LAB_00149615;
                      }
                    }
                    else {
                      ppPVar6 = refs_00->tail_;
                      pPVar42 = (PixOrCopyBlock *)refs->tail_;
                      local_178 = refs_00->last_block_;
                      local_198 = *(undefined1 (*) [8])refs_00;
                      pPStack_190 = refs_00->refs_;
                      local_188 = refs_00->tail_;
                      pPStack_180 = refs_00->free_blocks_;
                      refs_00->last_block_ = refs->last_block_;
                      iVar12 = refs->block_size_;
                      iVar15 = refs->error_;
                      pPVar7 = refs->refs_;
                      pPVar8 = refs->free_blocks_;
                      refs_00->tail_ = refs->tail_;
                      refs_00->free_blocks_ = pPVar8;
                      refs_00->block_size_ = iVar12;
                      refs_00->error_ = iVar15;
                      refs_00->refs_ = pPVar7;
                      refs->last_block_ = local_178;
                      refs->tail_ = local_188;
                      refs->free_blocks_ = pPStack_180;
                      *(undefined1 (*) [8])refs = local_198;
                      refs->refs_ = pPStack_190;
                      if (pPVar42 == local_1f8 && pPVar42 != (PixOrCopyBlock *)0x0) {
                        refs_00->tail_ = ppPVar18;
                      }
                      pVVar38 = refs_00;
                      if (ppPVar6 != (PixOrCopyBlock **)0x0 && ppPVar6 == ppPVar18) {
                        refs->tail_ = &local_1f8->next_;
                      }
                    }
                    local_1e8[(long)pVVar25] = local_240;
                    local_220[(long)pVVar25] = uVar24;
                    iVar12 = 0;
                    if (pVVar25 == (VP8LBackwardRefs *)0x0) {
                      *cache_bits_best = uVar47;
                    }
                  }
                }
LAB_00149615:
                if ((iVar12 != 9) && (iVar12 != 0)) goto LAB_00149d10;
                bVar50 = pVVar25 != (VP8LBackwardRefs *)0x0;
                pVVar25 = (VP8LBackwardRefs *)((long)&pVVar25[-1].last_block_ + 7);
              } while (bVar50);
              iVar12 = 0;
            }
          }
LAB_00149d10:
          if ((iVar12 != 0) && (iVar12 != 5)) {
            if (iVar12 == 2) goto LAB_0014a050;
            goto LAB_0014a085;
          }
          uVar47 = ~uVar24;
          uVar24 = uVar24 * 2;
          lz77_types_to_try = lz77_types_to_try & uVar47;
        } while (lz77_types_to_try != 0);
      }
      uVar24 = local_220[0];
      uVar13 = local_220[1];
      lVar46 = 1;
      lVar48 = 0;
      do {
        if (do_no_cache != 0 || lVar48 != 0) {
          if (local_220[lVar46] == 1) {
            hash_chain_00 = hash_chain;
            if (0x18 < quality) {
LAB_00149db3:
              if (lVar48 == 0) {
                iVar12 = 0;
              }
              else {
                iVar12 = *cache_bits_best;
              }
              pVVar38 = (VP8LBackwardRefs *)((long)&refs[1].block_size_ + lVar48);
              iVar15 = VP8LBackwardReferencesTraceBackwards
                                 (width,height,argb,iVar12,hash_chain_00,pVVar38,refs_00);
              pVVar21 = local_208;
              if (iVar15 != 0) {
                VP8LHistogramCreate(local_208,refs_00,iVar12);
                dVar45 = VP8LHistogramEstimateBits(pVVar21);
                if (dVar45 < local_1e8[lVar46]) {
                  ppPVar18 = refs_00->tail_;
                  lVar22 = (long)&refs[1].refs_ + lVar48;
                  lVar5 = *(long *)((long)&refs[1].tail_ + lVar48);
                  local_178 = refs_00->last_block_;
                  local_198 = *(undefined1 (*) [8])refs_00;
                  pPStack_190 = refs_00->refs_;
                  local_188 = refs_00->tail_;
                  pPStack_180 = refs_00->free_blocks_;
                  refs_00->last_block_ = *(PixOrCopyBlock **)((long)&refs[1].last_block_ + lVar48);
                  iVar12 = pVVar38->block_size_;
                  iVar15 = pVVar38->error_;
                  pPVar42 = *(PixOrCopyBlock **)((long)&refs[1].refs_ + lVar48);
                  pPVar7 = *(PixOrCopyBlock **)((long)&refs[1].free_blocks_ + lVar48);
                  refs_00->tail_ = *(PixOrCopyBlock ***)((long)&refs[1].tail_ + lVar48);
                  refs_00->free_blocks_ = pPVar7;
                  refs_00->block_size_ = iVar12;
                  refs_00->error_ = iVar15;
                  refs_00->refs_ = pPVar42;
                  *(PixOrCopyBlock **)((long)&refs[1].last_block_ + lVar48) = local_178;
                  *(PixOrCopyBlock ***)((long)&refs[1].tail_ + lVar48) = local_188;
                  *(PixOrCopyBlock **)((long)&refs[1].free_blocks_ + lVar48) = pPStack_180;
                  *(undefined1 (*) [8])pVVar38 = local_198;
                  *(PixOrCopyBlock **)((long)&refs[1].refs_ + lVar48) = pPStack_190;
                  if (lVar22 == lVar5 && lVar5 != 0) {
                    refs_00->tail_ = &refs_00->refs_;
                  }
                  if (ppPVar18 != (PixOrCopyBlock **)0x0 && ppPVar18 == &refs_00->refs_) {
                    *(long *)((long)&refs[1].tail_ + lVar48) = lVar22;
                  }
                }
              }
            }
          }
          else if ((0x18 < quality) &&
                  (hash_chain_00 = (VP8LHashChain *)&local_218, local_220[lVar46] == 4))
          goto LAB_00149db3;
          BackwardReferences2DLocality
                    (width,(VP8LBackwardRefs *)((long)&refs[1].block_size_ + lVar48));
          if (((lVar48 == 0) && (uVar24 == uVar13)) && (*cache_bits_best == 0)) {
            iVar12 = BackwardRefsClone(local_200,refs);
            if (iVar12 == 0) goto LAB_0014a050;
            break;
          }
        }
        lVar46 = lVar46 + -1;
        lVar48 = lVar48 + -0x28;
      } while (lVar48 != -0x50);
      local_234 = 0;
    }
LAB_0014a050:
    WebPSafeFree(local_218);
    pPStack_210 = (PixOrCopyBlock *)((ulong)pPStack_210 & 0xffffffff00000000);
    local_218 = (uint32_t *)0x0;
    VP8LFreeHistogram(local_208);
    pVVar25 = (VP8LBackwardRefs *)(ulong)local_234;
LAB_0014a085:
    if (((ulong)pVVar25 & 1) != 0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  else {
    *cache_bits_best = 0;
    iVar12 = BackwardReferencesLz77(width,height,argb,(int)hash_chain,(VP8LHashChain *)refs,pVVar38)
    ;
    if (iVar12 == 0) {
      pVVar38 = (VP8LBackwardRefs *)0x0;
    }
    else {
      BackwardReferences2DLocality(width,refs);
      pVVar38 = refs;
    }
    if (pVVar38 == (VP8LBackwardRefs *)0x0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
    ppPVar18 = pVVar38->tail_;
    ppPVar6 = refs->tail_;
    pPVar42 = pVVar38->last_block_;
    iVar14 = pVVar38->block_size_;
    iVar30 = pVVar38->error_;
    pPVar7 = pVVar38->refs_;
    ppPVar9 = pVVar38->tail_;
    pPVar8 = pVVar38->free_blocks_;
    pVVar38->last_block_ = refs->last_block_;
    iVar12 = refs->block_size_;
    iVar15 = refs->error_;
    pPVar10 = refs->refs_;
    pPVar11 = refs->free_blocks_;
    pVVar38->tail_ = refs->tail_;
    pVVar38->free_blocks_ = pPVar11;
    pVVar38->block_size_ = iVar12;
    pVVar38->error_ = iVar15;
    pVVar38->refs_ = pPVar10;
    refs->last_block_ = pPVar42;
    refs->tail_ = ppPVar9;
    refs->free_blocks_ = pPVar8;
    refs->block_size_ = iVar14;
    refs->error_ = iVar30;
    refs->refs_ = pPVar7;
    if (ppPVar6 == &refs->refs_ && ppPVar6 != (PixOrCopyBlock **)0x0) {
      pVVar38->tail_ = &pVVar38->refs_;
    }
    if (ppPVar18 == &pVVar38->refs_ && ppPVar18 != (PixOrCopyBlock **)0x0) {
      refs->tail_ = &refs->refs_;
    }
    if (pVVar38 == (VP8LBackwardRefs *)0x0) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  return VP8_ENC_OK;
}

Assistant:

WebPEncodingError VP8LGetBackwardReferences(
    int width, int height, const uint32_t* const argb, int quality,
    int low_effort, int lz77_types_to_try, int cache_bits_max, int do_no_cache,
    const VP8LHashChain* const hash_chain, VP8LBackwardRefs* const refs,
    int* const cache_bits_best) {
  if (low_effort) {
    VP8LBackwardRefs* refs_best;
    *cache_bits_best = cache_bits_max;
    refs_best = GetBackwardReferencesLowEffort(
        width, height, argb, cache_bits_best, hash_chain, refs);
    if (refs_best == NULL) return VP8_ENC_ERROR_OUT_OF_MEMORY;
    // Set it in first position.
    BackwardRefsSwap(refs_best, &refs[0]);
  } else {
    if (!GetBackwardReferences(width, height, argb, quality, lz77_types_to_try,
                               cache_bits_max, do_no_cache, hash_chain, refs,
                               cache_bits_best)) {
      return VP8_ENC_ERROR_OUT_OF_MEMORY;
    }
  }
  return VP8_ENC_OK;
}